

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian_inl_utils.h
# Opt level: O0

uint64_t BSwap64(uint64_t x)

{
  uint64_t x_local;
  
  return x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
         (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
         (x & 0xff00) << 0x28 | x << 0x38;
}

Assistant:

static WEBP_INLINE uint64_t BSwap64(uint64_t x) {
#if defined(HAVE_BUILTIN_BSWAP64)
  return __builtin_bswap64(x);
#elif defined(__x86_64__)
  uint64_t swapped_bytes;
  __asm__ volatile("bswapq %0" : "=r"(swapped_bytes) : "0"(x));
  return swapped_bytes;
#elif defined(_MSC_VER)
  return (uint64_t)_byteswap_uint64(x);
#else  // generic code for swapping 64-bit values (suggested by bdb@)
  x = ((x & 0xffffffff00000000ull) >> 32) | ((x & 0x00000000ffffffffull) << 32);
  x = ((x & 0xffff0000ffff0000ull) >> 16) | ((x & 0x0000ffff0000ffffull) << 16);
  x = ((x & 0xff00ff00ff00ff00ull) >>  8) | ((x & 0x00ff00ff00ff00ffull) <<  8);
  return x;
#endif  // HAVE_BUILTIN_BSWAP64
}